

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber.cpp
# Opt level: O0

string * __thiscall miniros::Subscriber::getTopic_abi_cxx11_(Subscriber *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr *in_RSI;
  string *in_RDI;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4ce159);
    std::__cxx11::string::string((string *)in_RDI,(string *)peVar2);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string Subscriber::getTopic() const
  {
    if (impl_)
      {
	return impl_->topic_;
      }

    return std::string();
  }